

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::InterpolateAtSamplePositionCase::init
          (InterpolateAtSamplePositionCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  ContextInfo *pCVar3;
  RenderContext *pRVar4;
  NotSupportedError *pNVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_1b0;
  deUint32 local_2c;
  ContextType local_28;
  deUint32 local_18;
  ContextType local_14;
  InterpolateAtSamplePositionCase *local_10;
  InterpolateAtSamplePositionCase *this_local;
  
  local_10 = this;
  pCVar3 = gles31::Context::getContextInfo
                     ((this->super_MultisampleRenderCase).super_TestCase.m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_OES_shader_multisample_interpolation");
  if (!bVar1) {
    pRVar4 = gles31::Context::getRenderContext
                       ((this->super_MultisampleRenderCase).super_TestCase.m_context);
    local_14.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
    local_18 = (deUint32)glu::ApiType::es(3,2);
    bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
    if (!bVar1) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar5,"Test requires GL_OES_shader_multisample_interpolation extension",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderMultisampleInterpolationTests.cpp"
                 ,0x552);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pCVar3 = gles31::Context::getContextInfo
                     ((this->super_MultisampleRenderCase).super_TestCase.m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_OES_sample_variables");
  if (!bVar1) {
    pRVar4 = gles31::Context::getRenderContext
                       ((this->super_MultisampleRenderCase).super_TestCase.m_context);
    local_28.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
    local_2c = (deUint32)glu::ApiType::es(3,2);
    bVar1 = glu::contextSupports(local_28,(ApiType)local_2c);
    if (!bVar1) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar5,"Test requires GL_OES_sample_variables extension",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderMultisampleInterpolationTests.cpp"
                 ,0x554);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_00 = tcu::TestContext::getLog
                      ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_1b0,
                      (char (*) [106])
                      "Verifying that interpolateAtOffset with the offset of current sample position returns consistent values.\n"
                     );
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [56])
                             "\tInterpolate varying containing screen space location.\n");
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [58])
                             "\t=> interpolateAtOffset(varying, currentOffset) = varying");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  iVar2 = MultisampleShaderRenderUtil::MultisampleRenderCase::init
                    (&this->super_MultisampleRenderCase,ctx_00);
  return iVar2;
}

Assistant:

void InterpolateAtSamplePositionCase::init (void)
{
	// requirements
	if (!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_multisample_interpolation") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		TCU_THROW(NotSupportedError, "Test requires GL_OES_shader_multisample_interpolation extension");
	if (!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_variables") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		TCU_THROW(NotSupportedError, "Test requires GL_OES_sample_variables extension");

	// test purpose and expectations
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that interpolateAtOffset with the offset of current sample position returns consistent values.\n"
		<< "	Interpolate varying containing screen space location.\n"
		<< "	=> interpolateAtOffset(varying, currentOffset) = varying"
		<< tcu::TestLog::EndMessage;

	MultisampleShaderRenderUtil::MultisampleRenderCase::init();
}